

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CountInv(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClassActor *type;
  VMValue *pVVar1;
  AActor *pAVar2;
  AInventory *pAVar3;
  bool bVar4;
  int local_6c;
  bool local_5e;
  bool local_5b;
  AInventory *item;
  int pick_pointer;
  MetaClass *itemtype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x143,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 1) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar4 = false;
    if (((param->field_0).field_3.Type == '\x03') &&
       (bVar4 = true, (param->field_0).field_1.atag != 1)) {
      bVar4 = (param->field_0).field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    local_5b = true;
    if (pAVar2 != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 2) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x145,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar4 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
      bVar4 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x145,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_5e = true;
    if (type != (PClassActor *)0x0) {
      local_5e = PClass::IsDescendantOf((PClass *)type,AInventory::RegistrationInfo.MyClass);
    }
    if (local_5e == false) {
      __assert_fail("itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x145,
                    "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x146,
                      "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      item._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x146,
                      "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      item._4_4_ = param[2].field_0.i;
    }
    pAVar2 = COPY_AAPTR(pAVar2,item._4_4_);
    if ((pAVar2 == (AActor *)0x0) || (type == (PClassActor *)0x0)) {
      VMReturn::SetInt(ret,0);
    }
    else {
      pAVar3 = AActor::FindInventory(pAVar2,type,false);
      if (pAVar3 == (AInventory *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = pAVar3->Amount;
      }
      VMReturn::SetInt(ret,local_6c);
    }
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountInv)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(itemtype, AInventory);
		PARAM_INT_DEF(pick_pointer);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == NULL || itemtype == NULL)
		{
			ret->SetInt(0);
		}
		else
		{
			AInventory *item = self->FindInventory(itemtype);
			ret->SetInt(item ? item->Amount : 0);
		}
		return 1;
	}
	return 0;
}